

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O2

string * __thiscall
duckdb::ExtensionHelper::ExtensionDirectory_abi_cxx11_
          (string *__return_storage_ptr__,ExtensionHelper *this,DatabaseInstance *db,FileSystem *fs)

{
  char cVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *split;
  pointer __rhs;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string extension_directory_prefix;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GetExtensionDirectoryPath_abi_cxx11_(__return_storage_ptr__,this,db,fs);
  cVar1 = (**(code **)((long)&(((db->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                                __weak_this_.internal.
                                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->config).extension_parameters + 0x18))
                    (db,__return_storage_ptr__,0);
  if (cVar1 == '\0') {
    (*(code *)(((string *)
               ((long)&(((db->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                         internal.
                         super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->config).options + 0x20))->_M_dataplus)._M_p)
              (&local_108,db,__return_storage_ptr__);
    StringUtil::Split(&local_e8,__return_storage_ptr__,&local_108);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    ::std::__cxx11::string::string((string *)&local_90,(string *)__return_storage_ptr__);
    ::std::__cxx11::string::string((string *)&local_b0,(string *)&local_108);
    bVar2 = StringUtil::StartsWith(&local_90,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_90);
    if (bVar2) {
      ::std::__cxx11::string::_M_assign((string *)&local_d0);
    }
    for (__rhs = local_e8.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __rhs != local_e8.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
      ::std::operator+(&local_70,&local_d0,__rhs);
      ::std::operator+(&local_50,&local_70,&local_108);
      ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      cVar1 = (**(code **)((long)&(((db->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                                    __weak_this_.internal.
                                    super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->config).extension_parameters + 0x18))(db,&local_d0,0);
      if (cVar1 == '\0') {
        (**(code **)((long)&(((db->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                              __weak_this_.internal.
                              super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->config).extension_parameters + 0x20))(db,&local_d0,0);
      }
    }
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

string ExtensionHelper::ExtensionDirectory(DatabaseInstance &db, FileSystem &fs) {
#ifdef WASM_LOADABLE_EXTENSIONS
	throw PermissionException("ExtensionDirectory functionality is not supported in duckdb-wasm");
#endif
	string extension_directory = GetExtensionDirectoryPath(db, fs);
	{
		if (!fs.DirectoryExists(extension_directory)) {
			auto sep = fs.PathSeparator(extension_directory);
			auto splits = StringUtil::Split(extension_directory, sep);
			D_ASSERT(!splits.empty());
			string extension_directory_prefix;
			if (StringUtil::StartsWith(extension_directory, sep)) {
				extension_directory_prefix = sep; // this is swallowed by Split otherwise
			}
			for (auto &split : splits) {
				extension_directory_prefix = extension_directory_prefix + split + sep;
				if (!fs.DirectoryExists(extension_directory_prefix)) {
					fs.CreateDirectory(extension_directory_prefix);
				}
			}
		}
	}
	D_ASSERT(fs.DirectoryExists(extension_directory));

	return extension_directory;
}